

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respondent.c
# Opt level: O1

int nn_respondent_send(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  size_t sVar2;
  
  if (((ulong)self[0x1b].vfptr & 1) == 0) {
    return -0x9523dfe;
  }
  sVar2 = nn_chunkref_size(&msg->sphdr);
  if (sVar2 == 0) {
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_mv(&msg->sphdr,(nn_chunkref *)&self[0x1b].sock);
    *(byte *)&self[0x1b].vfptr = *(byte *)&self[0x1b].vfptr & 0xfe;
    iVar1 = nn_xrespondent_send(self,msg);
    if (iVar1 == -0xb) {
      return 0;
    }
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    nn_respondent_send_cold_1();
  }
  nn_respondent_send_cold_2();
}

Assistant:

static int nn_respondent_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_respondent *respondent;

    respondent = nn_cont (self, struct nn_respondent, xrespondent.sockbase);

    /*  If there's no survey going on, report EFSM error. */
    if (nn_slow (!(respondent->flags & NN_RESPONDENT_INPROGRESS)))
        return -EFSM;

    /*  Tag the message with survey ID. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &respondent->backtrace);

    /*  Remember that no survey is being processed. */
    respondent->flags &= ~NN_RESPONDENT_INPROGRESS;

    /*  Try to send the message. If it cannot be sent due to pushback, drop it
        silently. */
    rc = nn_xrespondent_send (&respondent->xrespondent.sockbase, msg);
    errnum_assert (rc == 0 || rc == -EAGAIN, -rc);

    return 0;
}